

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_mput.c
# Opt level: O2

ufile_error ufile_multiple_upload_abort(ufile_mutipart_state *self)

{
  CURL *curl;
  uint uVar1;
  list_node *node;
  curls_list *pcVar2;
  char *pcVar3;
  ulong uVar4;
  ufile_error uVar5;
  http_options opt;
  char query [64];
  
  node = get_curl_handle(self->curls);
  if (node == (list_node *)0x0) {
    pcVar3 = "Other upload_part have not finish yet, please check your code calling order.";
    uVar4 = 0xfffffffffffffffb;
  }
  else {
    curl = node->curl;
    opt.header = (curl_slist *)0x0;
    opt.method = (char *)0x0;
    opt.url = (char *)0x0;
    query[0] = '\0';
    query[1] = '\0';
    query[2] = '\0';
    query[3] = '\0';
    query[4] = '\0';
    query[5] = '\0';
    query[6] = '\0';
    query[7] = '\0';
    query[8] = '\0';
    query[9] = '\0';
    query[10] = '\0';
    query[0xb] = '\0';
    query[0xc] = '\0';
    query[0xd] = '\0';
    query[0xe] = '\0';
    query[0xf] = '\0';
    query[0x10] = '\0';
    query[0x11] = '\0';
    query[0x12] = '\0';
    query[0x13] = '\0';
    query[0x14] = '\0';
    query[0x15] = '\0';
    query[0x16] = '\0';
    query[0x17] = '\0';
    query[0x18] = '\0';
    query[0x19] = '\0';
    query[0x1a] = '\0';
    query[0x1b] = '\0';
    query[0x1c] = '\0';
    query[0x1d] = '\0';
    query[0x1e] = '\0';
    query[0x1f] = '\0';
    query[0x20] = '\0';
    query[0x21] = '\0';
    query[0x22] = '\0';
    query[0x23] = '\0';
    query[0x24] = '\0';
    query[0x25] = '\0';
    query[0x26] = '\0';
    query[0x27] = '\0';
    query[0x28] = '\0';
    query[0x29] = '\0';
    query[0x2a] = '\0';
    query[0x2b] = '\0';
    query[0x2c] = '\0';
    query[0x2d] = '\0';
    query[0x2e] = '\0';
    query[0x2f] = '\0';
    query[0x30] = '\0';
    query[0x31] = '\0';
    query[0x32] = '\0';
    query[0x33] = '\0';
    query[0x34] = '\0';
    query[0x35] = '\0';
    query[0x36] = '\0';
    query[0x37] = '\0';
    query[0x38] = '\0';
    query[0x39] = '\0';
    query[0x3a] = '\0';
    query[0x3b] = '\0';
    query[0x3c] = '\0';
    query[0x3d] = '\0';
    query[0x3e] = '\0';
    query[0x3f] = '\0';
    sprintf(query,"uploadId=%s",self->upload_id);
    uVar5 = set_http_options(&opt,"DELETE","",self->bucket_name,self->key,query);
    pcVar3 = uVar5.message;
    uVar1 = uVar5.code;
    uVar4 = (ulong)uVar1;
    if (uVar1 == 0 || uVar1 - 200 < 100) {
      set_curl_options(curl,&opt);
      curl_easy_setopt(curl,0x2c,1);
      uVar5 = curl_do(curl);
      pcVar3 = uVar5.message;
      uVar4 = (ulong)(uint)uVar5.code;
      http_cleanup((CURL *)0x0,&opt);
    }
  }
  pcVar2 = save_curl_handle(self->curls,node);
  self->curls = pcVar2;
  free_state(self);
  uVar5._0_8_ = uVar4 & 0xffffffff;
  uVar5.message = pcVar3;
  return uVar5;
}

Assistant:

struct ufile_error
ufile_multiple_upload_abort(struct ufile_mutipart_state *self){
    struct ufile_error error=NO_ERROR;
    struct list_node *node = get_curl_handle(self->curls);
    if(node == NULL){
        error.code = UFILE_MULTIPLE_NOT_FINISH_ERROR_CODE;
        error.message = "Other upload_part have not finish yet, please check your code calling order.";
        goto FAILED;
    }
    CURL *curl = node->curl;

    struct http_options opt;
    memset(&opt, 0, sizeof(struct http_options));
    char query[64]={0};
    sprintf(query, "uploadId=%s",self->upload_id);
    error = set_http_options(&opt, "DELETE", "", self->bucket_name, self->key, query);
    if(UFILE_HAS_ERROR(error.code)){
        //set_http_options 在错误时不会分配内存，所以不需要释放。
        goto FAILED;
    }

    set_curl_options(curl, &opt);
    curl_easy_setopt(curl, CURLOPT_NOBODY, 1);
    error = curl_do(curl);
    http_cleanup(NULL, &opt);

FAILED:
    self->curls = save_curl_handle(self->curls, node); //把 curl 还回去，由 free_state 统一释放资源
    free_state(self);
    return error;
}